

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

int __thiscall astar::Map::At(Map *this,int x,int y)

{
  reference this_00;
  reference pvVar1;
  int y_local;
  int x_local;
  Map *this_local;
  
  if ((((x < this->m) && (y < this->n)) && (-1 < x)) && (-1 < y)) {
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[](&this->map,(long)x);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)y);
    this_local._4_4_ = *pvVar1;
  }
  else {
    this_local._4_4_ = 0x7fffffff;
  }
  return this_local._4_4_;
}

Assistant:

inline int Map::At(int x, int y)
{
    if (x >= m || y >= n || x < 0 || y < 0) {
        return illegal;
    }
    return map[x][y];
}